

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

_Bool Curl_auth_digest_get_pair(char *str,char *value,char *content,char **endptr)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  
  lVar7 = 0;
  lVar5 = 0;
  while( true ) {
    cVar1 = str[lVar7];
    if (((cVar1 == '\0') || (cVar1 == '=')) || ((int)lVar7 == 0xff)) break;
    value[lVar7] = cVar1;
    lVar5 = lVar5 + -1;
    lVar7 = lVar7 + 1;
  }
  value[lVar7] = '\0';
  if (str[lVar7] == '=') {
    cVar1 = str[lVar7 + 1];
    pcVar6 = str + 2;
    if (cVar1 != '\"') {
      pcVar6 = str + 1;
    }
    pcVar6 = pcVar6 + -lVar5;
    iVar4 = 0x3ff;
    bVar3 = false;
    while ((cVar2 = *pcVar6, cVar2 != '\0' && (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8))) {
      if (bVar3) goto LAB_004ceea2;
      if ((cVar2 == '\n') || (cVar2 == '\r')) {
        iVar4 = 0;
        if (cVar1 == '\"') {
          return false;
        }
      }
      else if (cVar2 == '\"') {
        iVar4 = 0;
        if (cVar1 != '\"') {
          return false;
        }
      }
      else if (cVar2 == ',') {
        if (cVar1 == '\"') goto LAB_004ceea2;
        iVar4 = 0;
      }
      else if ((cVar2 != '\\') || (bVar3 = true, cVar1 != '\"')) {
LAB_004ceea2:
        *content = cVar2;
        content = content + 1;
        bVar3 = false;
      }
      pcVar6 = pcVar6 + 1;
    }
    if (!bVar3) {
      *content = '\0';
      *endptr = pcVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool Curl_auth_digest_get_pair(const char *str, char *value, char *content,
                               const char **endptr)
{
  int c;
  bool starts_with_quote = FALSE;
  bool escape = FALSE;

  for(c = DIGEST_MAX_VALUE_LENGTH - 1; (*str && (*str != '=') && c--);)
    *value++ = *str++;
  *value = 0;

  if('=' != *str++)
    /* eek, no match */
    return FALSE;

  if('\"' == *str) {
    /* This starts with a quote so it must end with one as well! */
    str++;
    starts_with_quote = TRUE;
  }

  for(c = DIGEST_MAX_CONTENT_LENGTH - 1; *str && c--; str++) {
    if(!escape) {
      switch(*str) {
      case '\\':
        if(starts_with_quote) {
          /* the start of an escaped quote */
          escape = TRUE;
          continue;
        }
        break;

      case ',':
        if(!starts_with_quote) {
          /* This signals the end of the content if we didn't get a starting
             quote and then we do "sloppy" parsing */
          c = 0; /* the end */
          continue;
        }
        break;

      case '\r':
      case '\n':
        /* end of string */
        if(starts_with_quote)
          return FALSE; /* No closing quote */
        c = 0;
        continue;

      case '\"':
        if(starts_with_quote) {
          /* end of string */
          c = 0;
          continue;
        }
        else
          return FALSE;
      }
    }

    escape = FALSE;
    *content++ = *str;
  }
  if(escape)
    return FALSE; /* No character after backslash */

  *content = 0;
  *endptr = str;

  return TRUE;
}